

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

int mbedtls_net_recv_timeout(void *ctx,uchar *buf,size_t len,uint32_t timeout)

{
  int iVar1;
  int *piVar2;
  timeval *local_e0;
  fd_set *__arr;
  uint __i;
  int fd;
  fd_set read_fds;
  timeval tv;
  int ret;
  uint32_t timeout_local;
  size_t len_local;
  uchar *buf_local;
  void *ctx_local;
  
  iVar1 = *ctx;
  if (iVar1 < 0) {
    ctx_local._4_4_ = -0x45;
  }
  else {
    for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
      (&__i + (ulong)(uint)__arr * 2)[0] = 0;
      (&__i + (ulong)(uint)__arr * 2)[1] = 0;
    }
    *(ulong *)(&__i + (long)(iVar1 / 0x40) * 2) =
         1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | *(ulong *)(&__i + (long)(iVar1 / 0x40) * 2);
    read_fds.__fds_bits[0xf] = (ulong)timeout / 1000;
    if (timeout == 0) {
      local_e0 = (timeval *)0x0;
    }
    else {
      local_e0 = (timeval *)(read_fds.__fds_bits + 0xf);
    }
    iVar1 = select(iVar1 + 1,(fd_set *)&__i,(fd_set *)0x0,(fd_set *)0x0,local_e0);
    if (iVar1 == 0) {
      ctx_local._4_4_ = -0x6800;
    }
    else if (iVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 == 4) {
        ctx_local._4_4_ = -0x6900;
      }
      else {
        ctx_local._4_4_ = -0x4c;
      }
    }
    else {
      ctx_local._4_4_ = mbedtls_net_recv(ctx,buf,len);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_net_recv_timeout( void *ctx, unsigned char *buf, size_t len,
                      uint32_t timeout )
{
    int ret;
    struct timeval tv;
    fd_set read_fds;
    int fd = ((mbedtls_net_context *) ctx)->fd;

    if( fd < 0 )
        return( MBEDTLS_ERR_NET_INVALID_CONTEXT );

    FD_ZERO( &read_fds );
    FD_SET( fd, &read_fds );

    tv.tv_sec  = timeout / 1000;
    tv.tv_usec = ( timeout % 1000 ) * 1000;

    ret = select( fd + 1, &read_fds, NULL, NULL, timeout == 0 ? NULL : &tv );

    /* Zero fds ready means we timed out */
    if( ret == 0 )
        return( MBEDTLS_ERR_SSL_TIMEOUT );

    if( ret < 0 )
    {
#if ( defined(_WIN32) || defined(_WIN32_WCE) ) && !defined(EFIX64) && \
    !defined(EFI32)
        if( WSAGetLastError() == WSAEINTR )
            return( MBEDTLS_ERR_SSL_WANT_READ );
#else
        if( errno == EINTR )
            return( MBEDTLS_ERR_SSL_WANT_READ );
#endif

        return( MBEDTLS_ERR_NET_RECV_FAILED );
    }

    /* This call will not block */
    return( mbedtls_net_recv( ctx, buf, len ) );
}